

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# landb.cpp
# Opt level: O3

string * __thiscall lan::db::pop_next(string *__return_storage_ptr__,db *this,string *content)

{
  char *pcVar1;
  char cVar2;
  pointer pcVar3;
  ulong spoint;
  size_type sVar4;
  size_type sVar5;
  long lVar6;
  db *pdVar7;
  undefined1 local_f0 [16];
  undefined1 local_e0 [16];
  undefined1 local_d0 [16];
  undefined1 local_c0 [16];
  undefined1 local_b0 [16];
  size_type local_a0;
  string local_90;
  long *local_70 [2];
  long local_60 [2];
  long *local_50;
  long local_48;
  long local_40 [2];
  
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90," \n\t","");
  pcVar3 = (content->_M_dataplus)._M_p;
  pdVar7 = (db *)local_d0;
  local_d0._0_8_ = (db_bits *)local_c0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)pdVar7,pcVar3,pcVar3 + content->_M_string_length);
  spoint = str_find_first_not_of(pdVar7,&local_90,(string *)local_d0,0);
  if ((db_bits *)local_d0._0_8_ != (db_bits *)local_c0) {
    operator_delete((void *)local_d0._0_8_,(ulong)(local_c0._0_8_ + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  local_b0._0_8_ = (FILE *)(local_c0 + 0x20);
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_c0 + 0x10),"=:;()[] \n\t","");
  pcVar3 = (content->_M_dataplus)._M_p;
  pdVar7 = (db *)local_f0;
  local_f0._0_8_ = (db_bits *)local_e0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)pdVar7,pcVar3,pcVar3 + content->_M_string_length);
  sVar4 = str_find_first_of(pdVar7,(string *)(local_c0 + 0x10),(string *)local_f0,spoint);
  if ((db_bits *)local_f0._0_8_ != (db_bits *)local_e0) {
    operator_delete((void *)local_f0._0_8_,(ulong)(local_e0._0_8_ + 1));
  }
  if ((FILE *)local_b0._0_8_ != (FILE *)(local_c0 + 0x20)) {
    operator_delete((void *)local_b0._0_8_,local_a0 + 1);
  }
  sVar5 = sVar4;
  if ((long)sVar4 < 1) {
    sVar5 = content->_M_string_length;
  }
  if (-1 < (long)spoint) {
    sVar4 = sVar5;
  }
  if ((long)(sVar4 | spoint) < 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  else {
    cVar2 = (content->_M_dataplus)._M_p[spoint];
    local_50 = local_40;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,",=:;([])","");
    if ((local_48 != 0) && ((char)*local_50 != cVar2)) {
      lVar6 = 1;
      do {
        if (local_48 == lVar6) break;
        pcVar1 = (char *)((long)local_50 + lVar6);
        lVar6 = lVar6 + 1;
      } while (*pcVar1 != cVar2);
    }
    if (local_50 != local_40) {
      operator_delete(local_50,local_40[0] + 1);
    }
    std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)content);
    std::__cxx11::string::substr((ulong)local_70,(ulong)content);
    std::__cxx11::string::operator=((string *)content,(string *)local_70);
    if (local_70[0] != local_60) {
      operator_delete(local_70[0],local_60[0] + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string db::pop_next(std::string & content){
            ssize_t start_p = str_find_first_not_of(" \n\t\0", content, 0);
            ssize_t end_p = str_find_first_of("=:;()[] \n\t\0", content, start_p);
            end_p = (end_p <= 0 and start_p >= 0) ? content.length() : end_p;
            if (start_p >= 0 and end_p >= 0){
                end_p = (str_compare(content[start_p], ",=:;([])")) ? start_p+1 : end_p;
                std::string str = content.substr(start_p, end_p-start_p);
                content = content.substr(end_p, content.length() - str.length());
                return str;
            } else return "";
        }